

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_xor(array_container_t *array_1,array_container_t *array_2,
                        array_container_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t *in_RDX;
  array_container_t *in_RSI;
  int *in_RDI;
  int32_t max_cardinality;
  uint16_t *unaff_retaddr;
  int32_t card_2;
  int32_t card_1;
  uint16_t *in_stack_00000098;
  uint32_t in_stack_000000a4;
  uint16_t *in_stack_000000a8;
  uint32_t in_stack_000000b4;
  uint16_t *in_stack_000000b8;
  
  if ((int)in_RDX[1] < *in_RDI + in_RSI->cardinality) {
    array_container_grow(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  }
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 1) == 0) {
    uVar2 = xor_uint16((uint16_t *)array_1,array_2._4_4_,(uint16_t *)out,card_1,unaff_retaddr);
    *in_RDX = uVar2;
  }
  else {
    uVar2 = xor_vector16(in_stack_000000b8,in_stack_000000b4,in_stack_000000a8,in_stack_000000a4,
                         in_stack_00000098);
    *in_RDX = uVar2;
  }
  return;
}

Assistant:

void array_container_xor(const array_container_t *array_1,
                         const array_container_t *array_2,
                         array_container_t *out) {
    const int32_t card_1 = array_1->cardinality, card_2 = array_2->cardinality;
    const int32_t max_cardinality = card_1 + card_2;
    if (out->capacity < max_cardinality) {
        array_container_grow(out, max_cardinality, false);
    }

#if CROARING_IS_X64
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        out->cardinality =
            xor_vector16(array_1->array, array_1->cardinality, array_2->array,
                         array_2->cardinality, out->array);
    } else {
        out->cardinality =
            xor_uint16(array_1->array, array_1->cardinality, array_2->array,
                       array_2->cardinality, out->array);
    }
#else
    out->cardinality =
        xor_uint16(array_1->array, array_1->cardinality, array_2->array,
                   array_2->cardinality, out->array);
#endif
}